

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Shutdown(void)

{
  int *piVar1;
  ImFontAtlas *pIVar2;
  ImVec2 *pIVar3;
  char *pcVar4;
  ImGuiContextHook *pIVar5;
  ImGuiWindow **ppIVar6;
  ImGuiWindowStackData *pIVar7;
  ImGuiColorMod *pIVar8;
  ImGuiStyleMod *pIVar9;
  ImFont **ppIVar10;
  ImGuiPopupData *pIVar11;
  ImGuiViewportP **ppIVar12;
  ImGuiPtrOrIndex *pIVar13;
  ImGuiShrinkWidthItem *pIVar14;
  void *pvVar15;
  ImGuiListClipperData *pIVar16;
  ImGuiTableTempData *pIVar17;
  ImDrawChannel *pIVar18;
  uint *puVar19;
  ImGuiSettingsHandler *pIVar20;
  FILE *__stream;
  ImGuiContext *pIVar21;
  int iVar22;
  ImGuiContext *g;
  long lVar23;
  long lVar24;
  
  pIVar21 = GImGui;
  pIVar2 = (GImGui->IO).Fonts;
  if ((pIVar2 != (ImFontAtlas *)0x0) && (GImGui->FontAtlasOwnedByContext == true)) {
    pIVar2->Locked = false;
    IM_DELETE<ImFontAtlas>((pIVar21->IO).Fonts);
  }
  (pIVar21->IO).Fonts = (ImFontAtlas *)0x0;
  pIVar3 = (pIVar21->DrawListSharedData).TempBuffer.Data;
  if (pIVar3 != (ImVec2 *)0x0) {
    (pIVar21->DrawListSharedData).TempBuffer.Size = 0;
    (pIVar21->DrawListSharedData).TempBuffer.Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    (pIVar21->DrawListSharedData).TempBuffer.Data = (ImVec2 *)0x0;
  }
  if (pIVar21->Initialized == true) {
    if ((pIVar21->SettingsLoaded == true) &&
       (pcVar4 = (pIVar21->IO).IniFilename, pcVar4 != (char *)0x0)) {
      SaveIniSettingsToDisk(pcVar4);
    }
    iVar22 = (pIVar21->Hooks).Size;
    if (0 < iVar22) {
      lVar23 = 0;
      lVar24 = 0;
      do {
        pIVar5 = (pIVar21->Hooks).Data;
        if (*(int *)(pIVar5 + lVar23 + 4) == 6) {
          (**(code **)(pIVar5 + lVar23 + 0x10))(pIVar21,pIVar5 + lVar23);
          iVar22 = (pIVar21->Hooks).Size;
        }
        lVar24 = lVar24 + 1;
        lVar23 = lVar23 + 0x20;
      } while (lVar24 < iVar22);
    }
    if (0 < (pIVar21->Windows).Size) {
      lVar23 = 0;
      do {
        IM_DELETE<ImGuiWindow>((pIVar21->Windows).Data[lVar23]);
        lVar23 = lVar23 + 1;
      } while (lVar23 < (pIVar21->Windows).Size);
    }
    ppIVar6 = (pIVar21->Windows).Data;
    if (ppIVar6 != (ImGuiWindow **)0x0) {
      (pIVar21->Windows).Size = 0;
      (pIVar21->Windows).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
      (pIVar21->Windows).Data = (ImGuiWindow **)0x0;
    }
    ppIVar6 = (pIVar21->WindowsFocusOrder).Data;
    if (ppIVar6 != (ImGuiWindow **)0x0) {
      (pIVar21->WindowsFocusOrder).Size = 0;
      (pIVar21->WindowsFocusOrder).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
      (pIVar21->WindowsFocusOrder).Data = (ImGuiWindow **)0x0;
    }
    ppIVar6 = (pIVar21->WindowsTempSortBuffer).Data;
    if (ppIVar6 != (ImGuiWindow **)0x0) {
      (pIVar21->WindowsTempSortBuffer).Size = 0;
      (pIVar21->WindowsTempSortBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
      (pIVar21->WindowsTempSortBuffer).Data = (ImGuiWindow **)0x0;
    }
    pIVar21->CurrentWindow = (ImGuiWindow *)0x0;
    pIVar7 = (pIVar21->CurrentWindowStack).Data;
    if (pIVar7 != (ImGuiWindowStackData *)0x0) {
      (pIVar21->CurrentWindowStack).Size = 0;
      (pIVar21->CurrentWindowStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
      (pIVar21->CurrentWindowStack).Data = (ImGuiWindowStackData *)0x0;
    }
    ImGuiStorage::Clear(&pIVar21->WindowsById);
    pIVar21->NavWindow = (ImGuiWindow *)0x0;
    pIVar21->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    pIVar21->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar21->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar21->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar21->MovingWindow = (ImGuiWindow *)0x0;
    ImGuiKeyRoutingTable::Clear(&pIVar21->KeysRoutingTable);
    pIVar8 = (pIVar21->ColorStack).Data;
    if (pIVar8 != (ImGuiColorMod *)0x0) {
      (pIVar21->ColorStack).Size = 0;
      (pIVar21->ColorStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar8,GImAllocatorUserData);
      (pIVar21->ColorStack).Data = (ImGuiColorMod *)0x0;
    }
    pIVar9 = (pIVar21->StyleVarStack).Data;
    if (pIVar9 != (ImGuiStyleMod *)0x0) {
      (pIVar21->StyleVarStack).Size = 0;
      (pIVar21->StyleVarStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar9,GImAllocatorUserData);
      (pIVar21->StyleVarStack).Data = (ImGuiStyleMod *)0x0;
    }
    ppIVar10 = (pIVar21->FontStack).Data;
    if (ppIVar10 != (ImFont **)0x0) {
      (pIVar21->FontStack).Size = 0;
      (pIVar21->FontStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar10,GImAllocatorUserData);
      (pIVar21->FontStack).Data = (ImFont **)0x0;
    }
    pIVar11 = (pIVar21->OpenPopupStack).Data;
    if (pIVar11 != (ImGuiPopupData *)0x0) {
      (pIVar21->OpenPopupStack).Size = 0;
      (pIVar21->OpenPopupStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar11,GImAllocatorUserData);
      (pIVar21->OpenPopupStack).Data = (ImGuiPopupData *)0x0;
    }
    pIVar11 = (pIVar21->BeginPopupStack).Data;
    if (pIVar11 != (ImGuiPopupData *)0x0) {
      (pIVar21->BeginPopupStack).Size = 0;
      (pIVar21->BeginPopupStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar11,GImAllocatorUserData);
      (pIVar21->BeginPopupStack).Data = (ImGuiPopupData *)0x0;
    }
    if (0 < (pIVar21->Viewports).Size) {
      lVar23 = 0;
      do {
        IM_DELETE<ImGuiViewportP>((pIVar21->Viewports).Data[lVar23]);
        lVar23 = lVar23 + 1;
      } while (lVar23 < (pIVar21->Viewports).Size);
    }
    ppIVar12 = (pIVar21->Viewports).Data;
    if (ppIVar12 != (ImGuiViewportP **)0x0) {
      (pIVar21->Viewports).Size = 0;
      (pIVar21->Viewports).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar12,GImAllocatorUserData);
      (pIVar21->Viewports).Data = (ImGuiViewportP **)0x0;
    }
    ImPool<ImGuiTabBar>::Clear(&pIVar21->TabBars);
    pIVar13 = (pIVar21->CurrentTabBarStack).Data;
    if (pIVar13 != (ImGuiPtrOrIndex *)0x0) {
      (pIVar21->CurrentTabBarStack).Size = 0;
      (pIVar21->CurrentTabBarStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar13,GImAllocatorUserData);
      (pIVar21->CurrentTabBarStack).Data = (ImGuiPtrOrIndex *)0x0;
    }
    pIVar14 = (pIVar21->ShrinkWidthBuffer).Data;
    if (pIVar14 != (ImGuiShrinkWidthItem *)0x0) {
      (pIVar21->ShrinkWidthBuffer).Size = 0;
      (pIVar21->ShrinkWidthBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar14,GImAllocatorUserData);
      (pIVar21->ShrinkWidthBuffer).Data = (ImGuiShrinkWidthItem *)0x0;
    }
    iVar22 = (pIVar21->ClipperTempData).Size;
    if (0 < iVar22) {
      lVar23 = 0x20;
      lVar24 = 0;
      do {
        pvVar15 = *(void **)((long)&((pIVar21->ClipperTempData).Data)->ListClipper + lVar23);
        if (pvVar15 != (void *)0x0) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pvVar15,GImAllocatorUserData);
          iVar22 = (pIVar21->ClipperTempData).Size;
        }
        lVar24 = lVar24 + 1;
        lVar23 = lVar23 + 0x28;
      } while (lVar24 < iVar22);
    }
    pIVar16 = (pIVar21->ClipperTempData).Data;
    if (pIVar16 != (ImGuiListClipperData *)0x0) {
      (pIVar21->ClipperTempData).Size = 0;
      (pIVar21->ClipperTempData).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar16,GImAllocatorUserData);
      (pIVar21->ClipperTempData).Data = (ImGuiListClipperData *)0x0;
    }
    ImPool<ImGuiTable>::Clear(&pIVar21->Tables);
    if (0 < (pIVar21->TablesTempData).Size) {
      lVar23 = 0x10;
      lVar24 = 0;
      do {
        pIVar17 = (pIVar21->TablesTempData).Data;
        ImDrawListSplitter::ClearFreeMemory
                  ((ImDrawListSplitter *)((long)&pIVar17->TableIndex + lVar23));
        pvVar15 = *(void **)((long)&(pIVar17->DrawSplitter)._Current + lVar23);
        if (pvVar15 != (void *)0x0) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pvVar15,GImAllocatorUserData);
        }
        lVar24 = lVar24 + 1;
        lVar23 = lVar23 + 0x70;
      } while (lVar24 < (pIVar21->TablesTempData).Size);
    }
    pIVar17 = (pIVar21->TablesTempData).Data;
    if (pIVar17 != (ImGuiTableTempData *)0x0) {
      (pIVar21->TablesTempData).Size = 0;
      (pIVar21->TablesTempData).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar17,GImAllocatorUserData);
      (pIVar21->TablesTempData).Data = (ImGuiTableTempData *)0x0;
    }
    pIVar18 = (pIVar21->DrawChannelsTempMergeBuffer).Data;
    if (pIVar18 != (ImDrawChannel *)0x0) {
      (pIVar21->DrawChannelsTempMergeBuffer).Size = 0;
      (pIVar21->DrawChannelsTempMergeBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
      (pIVar21->DrawChannelsTempMergeBuffer).Data = (ImDrawChannel *)0x0;
    }
    pcVar4 = (pIVar21->ClipboardHandlerData).Data;
    if (pcVar4 != (char *)0x0) {
      (pIVar21->ClipboardHandlerData).Size = 0;
      (pIVar21->ClipboardHandlerData).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar4,GImAllocatorUserData);
      (pIVar21->ClipboardHandlerData).Data = (char *)0x0;
    }
    puVar19 = (pIVar21->MenusIdSubmittedThisFrame).Data;
    if (puVar19 != (uint *)0x0) {
      (pIVar21->MenusIdSubmittedThisFrame).Size = 0;
      (pIVar21->MenusIdSubmittedThisFrame).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar19,GImAllocatorUserData);
      (pIVar21->MenusIdSubmittedThisFrame).Data = (uint *)0x0;
    }
    ImGuiInputTextState::ClearFreeMemory(&pIVar21->InputTextState);
    ImChunkStream<ImGuiWindowSettings>::clear(&pIVar21->SettingsWindows);
    pIVar20 = (pIVar21->SettingsHandlers).Data;
    if (pIVar20 != (ImGuiSettingsHandler *)0x0) {
      (pIVar21->SettingsHandlers).Size = 0;
      (pIVar21->SettingsHandlers).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar20,GImAllocatorUserData);
      (pIVar21->SettingsHandlers).Data = (ImGuiSettingsHandler *)0x0;
    }
    __stream = (FILE *)pIVar21->LogFile;
    if (__stream != (FILE *)0x0) {
      if (__stream != _stdout) {
        fclose(__stream);
      }
      pIVar21->LogFile = (ImFileHandle)0x0;
    }
    ImGuiTextBuffer::clear(&pIVar21->LogBuffer);
    ImGuiTextBuffer::clear(&pIVar21->DebugLogBuf);
    ImGuiTextIndex::clear(&pIVar21->DebugLogIndex);
    pIVar21->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown()
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *GImGui;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;
    g.DrawListSharedData.TempBuffer.clear();

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
        SaveIniSettingsToDisk(g.IO.IniFilename);

    CallContextHooks(&g, ImGuiContextHookType_Shutdown);

    // Clear everything else
    g.Windows.clear_delete();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;

    g.KeysRoutingTable.Clear();

    g.ColorStack.clear();
    g.StyleVarStack.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    g.Viewports.clear_delete();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.ClipperTempData.clear_destruct();

    g.Tables.Clear();
    g.TablesTempData.clear_destruct();
    g.DrawChannelsTempMergeBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();
    g.DebugLogBuf.clear();
    g.DebugLogIndex.clear();

    g.Initialized = false;
}